

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textures.h
# Opt level: O2

Float __thiscall pbrt::FloatImageTexture::Evaluate(FloatImageTexture *this,TextureEvalContext ctx)

{
  bool bVar1;
  float fVar2;
  undefined1 auVar3 [16];
  anon_class_24_3_48d30edf func;
  float fVar4;
  undefined1 auVar5 [64];
  Tuple2<pbrt::Vector2,_float> local_78;
  Tuple2<pbrt::Vector2,_float> local_70;
  Tuple2<pbrt::Vector2,_float> *local_68;
  Tuple2<pbrt::Vector2,_float> *local_60;
  Tuple3<pbrt::Point3,_float> local_58 [2];
  Tuple3<pbrt::Vector3,_float> aTStack_40 [3];
  int iStack_1c;
  undefined1 extraout_var [56];
  
  local_60 = &local_70;
  local_68 = &local_78;
  local_70.x = 0.0;
  local_70.y = 0.0;
  local_78.x = 0.0;
  local_78.y = 0.0;
  local_58[0].x = ctx.p.super_Tuple3<pbrt::Point3,_float>.x;
  local_58[0].y = ctx.p.super_Tuple3<pbrt::Point3,_float>.y;
  local_58[0].z = ctx.p.super_Tuple3<pbrt::Point3,_float>.z;
  local_58[1].x = ctx.dpdx.super_Tuple3<pbrt::Vector3,_float>.x;
  local_58[1].y = ctx.dpdx.super_Tuple3<pbrt::Vector3,_float>.y;
  local_58[1].z = ctx.dpdx.super_Tuple3<pbrt::Vector3,_float>.z;
  aTStack_40[0].x = ctx.dpdy.super_Tuple3<pbrt::Vector3,_float>.x;
  aTStack_40[0].y = ctx.dpdy.super_Tuple3<pbrt::Vector3,_float>.y;
  aTStack_40[0].z = ctx.dpdy.super_Tuple3<pbrt::Vector3,_float>.z;
  aTStack_40[1].x = ctx.uv.super_Tuple2<pbrt::Point2,_float>.x;
  aTStack_40[1].y = ctx.uv.super_Tuple2<pbrt::Point2,_float>.y;
  aTStack_40[1].z = ctx.dudx;
  aTStack_40[2].x = ctx.dudy;
  aTStack_40[2].y = ctx.dvdx;
  aTStack_40[2].z = ctx.dvdy;
  iStack_1c = ctx.faceIndex;
  func.dstdx = (Vector2f **)&local_60;
  func.ctx = (TextureEvalContext *)local_58;
  func.dstdy = (Vector2f **)&local_68;
  auVar5._0_8_ = TaggedPointer<pbrt::UVMapping2D,pbrt::SphericalMapping2D,pbrt::CylindricalMapping2D,pbrt::PlanarMapping2D>
                 ::
                 Dispatch<pbrt::TextureMapping2DHandle::Map(pbrt::TextureEvalContext,pbrt::Vector2<float>*,pbrt::Vector2<float>*)const::_lambda(auto:1)_1_>
                           ((TaggedPointer<pbrt::UVMapping2D,pbrt::SphericalMapping2D,pbrt::CylindricalMapping2D,pbrt::PlanarMapping2D>
                             *)this,func);
  auVar5._8_56_ = extraout_var;
  auVar3 = vmovshdup_avx(auVar5._0_16_);
  fVar2 = (this->super_ImageTextureBase).scale;
  auVar3 = vinsertps_avx(auVar5._0_16_,ZEXT416((uint)(1.0 - auVar3._0_4_)),0x10);
  fVar4 = MIPMap::Filter<float>
                    ((this->super_ImageTextureBase).mipmap,(Point2f)auVar3._0_8_,(Vector2f)local_70,
                     (Vector2f)local_78);
  fVar4 = fVar4 * fVar2;
  bVar1 = (this->super_ImageTextureBase).invert;
  auVar3 = vmaxss_avx(ZEXT416((uint)(1.0 - fVar4)),ZEXT816(0) << 0x40);
  return (Float)((uint)(bVar1 & 1) * auVar3._0_4_ + (uint)!(bool)(bVar1 & 1) * (int)fVar4);
}

Assistant:

PBRT_CPU_GPU
    Float Evaluate(TextureEvalContext ctx) const {
#ifdef PBRT_IS_GPU_CODE
        assert(!"Should not be called in GPU code");
        return 0;
#else
        Vector2f dstdx, dstdy;
        Point2f st = mapping.Map(ctx, &dstdx, &dstdy);
        // Texture coordinates are (0,0) in the lower left corner, but
        // image coordinates are (0,0) in the upper left.
        st[1] = 1 - st[1];
        Float v = scale * mipmap->Filter<Float>(st, dstdx, dstdy);
        return invert ? std::max<Float>(0, 1 - v) : v;
#endif
    }